

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentParser.hpp
# Opt level: O2

string * __thiscall
Utils::ArgOption<unsigned_int>::get_message_abi_cxx11_
          (string *__return_storage_ptr__,ArgOption<unsigned_int> *this)

{
  pointer pbVar1;
  pointer pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> o;
  string opt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&opt,"\x1b[1m",(allocator *)&o);
  pbVar1 = (this->opts).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar2 = (this->opts).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    std::__cxx11::string::string((string *)&o,(string *)pbVar2);
    if (o._M_string_length == 1) {
      std::operator+(&local_50,"-",&o);
      std::operator+(&local_b0,&local_50," ");
      std::__cxx11::string::append((string *)&opt);
    }
    else {
      std::operator+(&local_50,"--",&o);
      std::operator+(&local_b0,&local_50," ");
      std::__cxx11::string::append((string *)&opt);
    }
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&o);
  }
  std::operator+(&local_b0,"<",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(this->super_TypedArgObj<unsigned_int>).field_0x8);
  std::operator+(&o,&local_b0,">\x1b[0m");
  std::__cxx11::string::append((string *)&opt);
  std::__cxx11::string::~string((string *)&o);
  std::__cxx11::string::~string((string *)&local_b0);
  ArgObject::argument_message(__return_storage_ptr__,(ArgObject *)this,&opt,8,0x50);
  std::__cxx11::string::~string((string *)&opt);
  return __return_storage_ptr__;
}

Assistant:

const std::string get_message() {
        std::string opt("\e[1m");
        for (auto o : opts) {
            if (o.size() == 1) opt += "-"  + o + " ";
            else               opt += "--" + o + " ";
        }
        opt += "<" + this->get_name() + ">\e[0m";
        return this->argument_message(opt,8,80);
    }